

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidjson.h
# Opt level: O3

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseValue<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericStringStream<rapidjson::UTF8<char>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  byte bVar1;
  Ch *pCVar2;
  double dVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  char *pcVar7;
  char *pcVar8;
  byte *pbVar9;
  long lVar10;
  byte *pbVar11;
  ulong i;
  double *pdVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  SizeType SVar16;
  int iVar17;
  byte bVar18;
  uint uVar19;
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  
  bVar1 = *is->src_;
  if (bVar1 < 0x6e) {
    if (bVar1 == 0x22) {
      ParseString<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                (this,is,handler,false);
      return;
    }
    if (bVar1 != 0x5b) {
      if (bVar1 != 0x66) {
        ParseNumber<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                  (this,is,handler);
        return;
      }
      pcVar7 = is->src_;
      if (*pcVar7 != 'f') {
        __assert_fail("is.Peek() == \'f\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                      ,0x243,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseFalse(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      pcVar8 = pcVar7 + 2;
      is->src_ = pcVar8;
      if (pcVar7[1] == 'a') {
        pcVar8 = pcVar7 + 3;
        is->src_ = pcVar8;
        if (pcVar7[2] == 'l') {
          pcVar8 = pcVar7 + 4;
          is->src_ = pcVar8;
          if (pcVar7[3] == 's') {
            pcVar8 = pcVar7 + 5;
            is->src_ = pcVar8;
            if (pcVar7[4] == 'e') {
              pcVar7 = (handler->stack_).stackTop_;
              if ((handler->stack_).stackEnd_ <= pcVar7 + 0x18) {
                internal::Stack<rapidjson::CrtAllocator>::
                Expand<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                          (&handler->stack_,1);
                pcVar7 = (handler->stack_).stackTop_;
              }
              (handler->stack_).stackTop_ = pcVar7 + 0x18;
              pcVar7[0] = '\0';
              pcVar7[1] = '\0';
              pcVar7[2] = '\0';
              pcVar7[3] = '\0';
              pcVar7[4] = '\0';
              pcVar7[5] = '\0';
              pcVar7[6] = '\0';
              pcVar7[7] = '\0';
              pcVar7[8] = '\0';
              pcVar7[9] = '\0';
              pcVar7[10] = '\0';
              pcVar7[0xb] = '\0';
              pcVar7[0xc] = '\0';
              pcVar7[0xd] = '\0';
              pcVar7[0xe] = '\0';
              pcVar7[0xf] = '\0';
              pcVar7[0x10] = '\x01';
              pcVar7[0x11] = '\x01';
              pcVar7[0x12] = '\0';
              pcVar7[0x13] = '\0';
              return;
            }
          }
        }
      }
      if (*(int *)(this + 0x30) == 0) {
        pCVar2 = is->head_;
        *(undefined4 *)(this + 0x30) = 3;
        *(char **)(this + 0x38) = pcVar8 + ~(ulong)pCVar2;
        return;
      }
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                    ,0x24b,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseFalse(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    if (*is->src_ != '[') {
      __assert_fail("is.Peek() == \'[\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                    ,0x206,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseArray(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    is->src_ = is->src_ + 1;
    pcVar7 = (handler->stack_).stackTop_;
    if ((handler->stack_).stackEnd_ <= pcVar7 + 0x18) {
      internal::Stack<rapidjson::CrtAllocator>::
      Expand<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                (&handler->stack_,1);
      pcVar7 = (handler->stack_).stackTop_;
    }
    (handler->stack_).stackTop_ = pcVar7 + 0x18;
    pcVar7[0] = '\0';
    pcVar7[1] = '\0';
    pcVar7[2] = '\0';
    pcVar7[3] = '\0';
    pcVar7[4] = '\0';
    pcVar7[5] = '\0';
    pcVar7[6] = '\0';
    pcVar7[7] = '\0';
    pcVar7[8] = '\0';
    pcVar7[9] = '\0';
    pcVar7[10] = '\0';
    pcVar7[0xb] = '\0';
    pcVar7[0xc] = '\0';
    pcVar7[0xd] = '\0';
    pcVar7[0xe] = '\0';
    pcVar7[0xf] = '\0';
    pcVar7[0x10] = '\x04';
    pcVar7[0x11] = '\0';
    pcVar7[0x12] = '\0';
    pcVar7[0x13] = '\0';
    pbVar9 = (byte *)is->src_;
    while (((ulong)*pbVar9 < 0x21 && ((0x100002600U >> ((ulong)*pbVar9 & 0x3f) & 1) != 0))) {
      pbVar9 = pbVar9 + 1;
    }
    is->src_ = (Ch *)pbVar9;
    if (*pbVar9 == 0x5d) {
      is->src_ = (Ch *)(pbVar9 + 1);
      bVar6 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
              ::EndArray(handler,0);
      if (!bVar6) {
        if (*(int *)(this + 0x30) != 0) {
          __assert_fail("!HasParseError()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                        ,0x211,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseArray(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
LAB_0011b777:
        lVar10 = (long)is->src_ - (long)is->head_;
        *(undefined4 *)(this + 0x30) = 0x10;
LAB_0011b785:
        *(long *)(this + 0x38) = lVar10;
      }
    }
    else {
      ParseValue<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                (this,is,handler);
      if (*(int *)(this + 0x30) == 0) {
        SVar16 = 0;
        do {
          pbVar11 = (byte *)(is->src_ + 1);
          pbVar9 = pbVar11;
          while (((ulong)pbVar9[-1] < 0x21 &&
                 ((0x100002600U >> ((ulong)pbVar9[-1] & 0x3f) & 1) != 0))) {
            pbVar9 = pbVar9 + 1;
            pbVar11 = pbVar11 + 1;
          }
          SVar16 = SVar16 + 1;
          is->src_ = (Ch *)pbVar9;
          if (pbVar9[-1] != 0x2c) {
            if (pbVar9[-1] != 0x5d) {
              lVar10 = (long)pbVar11 - (long)is->head_;
              *(undefined4 *)(this + 0x30) = 7;
              goto LAB_0011b785;
            }
            bVar6 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                    ::EndArray(handler,SVar16);
            if (bVar6) {
              return;
            }
            if (*(int *)(this + 0x30) != 0) {
              __assert_fail("!HasParseError()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                            ,0x220,
                            "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseArray(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                           );
            }
            goto LAB_0011b777;
          }
          while (((ulong)*pbVar9 < 0x21 && ((0x100002600U >> ((ulong)*pbVar9 & 0x3f) & 1) != 0))) {
            pbVar9 = pbVar9 + 1;
          }
          is->src_ = (Ch *)pbVar9;
          ParseValue<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                    (this,is,handler);
        } while (*(int *)(this + 0x30) == 0);
      }
    }
    return;
  }
  if (bVar1 == 0x7b) {
    if (*is->src_ != '{') {
      __assert_fail("is.Peek() == \'{\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                    ,0x1d4,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseObject(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    is->src_ = is->src_ + 1;
    pcVar7 = (handler->stack_).stackTop_;
    if ((handler->stack_).stackEnd_ <= pcVar7 + 0x18) {
      internal::Stack<rapidjson::CrtAllocator>::
      Expand<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                (&handler->stack_,1);
      pcVar7 = (handler->stack_).stackTop_;
    }
    (handler->stack_).stackTop_ = pcVar7 + 0x18;
    pcVar7[0] = '\0';
    pcVar7[1] = '\0';
    pcVar7[2] = '\0';
    pcVar7[3] = '\0';
    pcVar7[4] = '\0';
    pcVar7[5] = '\0';
    pcVar7[6] = '\0';
    pcVar7[7] = '\0';
    pcVar7[8] = '\0';
    pcVar7[9] = '\0';
    pcVar7[10] = '\0';
    pcVar7[0xb] = '\0';
    pcVar7[0xc] = '\0';
    pcVar7[0xd] = '\0';
    pcVar7[0xe] = '\0';
    pcVar7[0xf] = '\0';
    pcVar7[0x10] = '\x03';
    pcVar7[0x11] = '\0';
    pcVar7[0x12] = '\0';
    pcVar7[0x13] = '\0';
    pbVar9 = (byte *)is->src_;
    while (((ulong)*pbVar9 < 0x21 && ((0x100002600U >> ((ulong)*pbVar9 & 0x3f) & 1) != 0))) {
      pbVar9 = pbVar9 + 1;
    }
    is->src_ = (Ch *)pbVar9;
    if (*pbVar9 == 0x7d) {
      is->src_ = (Ch *)(pbVar9 + 1);
      bVar6 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
              ::EndObject(handler,0);
      if (bVar6) {
        return;
      }
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                      ,0x1df,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseObject(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
LAB_0011b5f4:
      lVar10 = (long)is->src_ - (long)is->head_;
      *(undefined4 *)(this + 0x30) = 0x10;
    }
    else {
      if (*pbVar9 == 0x22) {
        SVar16 = 0;
        do {
          ParseString<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                    (this,is,handler,true);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          pbVar11 = (byte *)(is->src_ + 1);
          pbVar9 = pbVar11;
          while (((ulong)pbVar9[-1] < 0x21 &&
                 ((0x100002600U >> ((ulong)pbVar9[-1] & 0x3f) & 1) != 0))) {
            pbVar9 = pbVar9 + 1;
            pbVar11 = pbVar11 + 1;
          }
          is->src_ = (Ch *)pbVar9;
          if (pbVar9[-1] != 0x3a) {
            lVar10 = (long)pbVar11 - (long)is->head_;
            *(undefined4 *)(this + 0x30) = 5;
            goto LAB_0011b619;
          }
          while (((ulong)*pbVar9 < 0x21 && ((0x100002600U >> ((ulong)*pbVar9 & 0x3f) & 1) != 0))) {
            pbVar9 = pbVar9 + 1;
          }
          is->src_ = (Ch *)pbVar9;
          ParseValue<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                    (this,is,handler);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          pbVar9 = (byte *)(is->src_ + 1);
          pbVar11 = pbVar9;
          while (((ulong)pbVar9[-1] < 0x21 &&
                 ((0x100002600U >> ((ulong)pbVar9[-1] & 0x3f) & 1) != 0))) {
            pbVar9 = pbVar9 + 1;
            pbVar11 = pbVar11 + 1;
          }
          SVar16 = SVar16 + 1;
          is->src_ = (Ch *)pbVar9;
          if (pbVar9[-1] != 0x2c) {
            if (pbVar9[-1] != 0x7d) {
              lVar10 = (long)pbVar11 - (long)is->head_;
              *(undefined4 *)(this + 0x30) = 6;
              goto LAB_0011b619;
            }
            bVar6 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                    ::EndObject(handler,SVar16);
            if (bVar6) {
              return;
            }
            if (*(int *)(this + 0x30) != 0) {
              __assert_fail("!HasParseError()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                            ,0x1fc,
                            "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseObject(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                           );
            }
            goto LAB_0011b5f4;
          }
          while (((ulong)*pbVar9 < 0x21 && ((0x100002600U >> ((ulong)*pbVar9 & 0x3f) & 1) != 0))) {
            pbVar9 = pbVar9 + 1;
          }
          is->src_ = (Ch *)pbVar9;
        } while (*pbVar9 == 0x22);
      }
      else if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                      ,0x1e5,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseObject(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      lVar10 = (long)pbVar9 - (long)is->head_;
      *(undefined4 *)(this + 0x30) = 4;
    }
LAB_0011b619:
    *(long *)(this + 0x38) = lVar10;
    return;
  }
  if (bVar1 == 0x74) {
    pcVar7 = is->src_;
    if (*pcVar7 != 't') {
      __assert_fail("is.Peek() == \'t\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                    ,0x236,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseTrue(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    pcVar8 = pcVar7 + 2;
    is->src_ = pcVar8;
    if (pcVar7[1] == 'r') {
      pcVar8 = pcVar7 + 3;
      is->src_ = pcVar8;
      if (pcVar7[2] == 'u') {
        pcVar8 = pcVar7 + 4;
        is->src_ = pcVar8;
        if (pcVar7[3] == 'e') {
          pcVar7 = (handler->stack_).stackTop_;
          if ((handler->stack_).stackEnd_ <= pcVar7 + 0x18) {
            internal::Stack<rapidjson::CrtAllocator>::
            Expand<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                      (&handler->stack_,1);
            pcVar7 = (handler->stack_).stackTop_;
          }
          (handler->stack_).stackTop_ = pcVar7 + 0x18;
          pcVar7[0] = '\0';
          pcVar7[1] = '\0';
          pcVar7[2] = '\0';
          pcVar7[3] = '\0';
          pcVar7[4] = '\0';
          pcVar7[5] = '\0';
          pcVar7[6] = '\0';
          pcVar7[7] = '\0';
          pcVar7[8] = '\0';
          pcVar7[9] = '\0';
          pcVar7[10] = '\0';
          pcVar7[0xb] = '\0';
          pcVar7[0xc] = '\0';
          pcVar7[0xd] = '\0';
          pcVar7[0xe] = '\0';
          pcVar7[0xf] = '\0';
          pcVar7[0x10] = '\x02';
          pcVar7[0x11] = '\x01';
          pcVar7[0x12] = '\0';
          pcVar7[0x13] = '\0';
          return;
        }
      }
    }
    if (*(int *)(this + 0x30) == 0) {
      pCVar2 = is->head_;
      *(undefined4 *)(this + 0x30) = 3;
      *(char **)(this + 0x38) = pcVar8 + ~(ulong)pCVar2;
      return;
    }
    __assert_fail("!HasParseError()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                  ,0x23e,
                  "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseTrue(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                 );
  }
  if (bVar1 == 0x6e) {
    ParseNull<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
              (this,is,handler);
    return;
  }
  pbVar9 = (byte *)is->src_;
  bVar1 = *pbVar9;
  bVar18 = bVar1;
  if (bVar1 == 0x2d) {
    pbVar11 = pbVar9 + 1;
    pbVar9 = pbVar9 + 1;
    bVar18 = *pbVar11;
  }
  pCVar2 = is->head_;
  if (bVar18 == 0x30) {
    bVar18 = pbVar9[1];
    pbVar9 = pbVar9 + 1;
    dVar3 = 0.0;
    bVar6 = false;
    bVar5 = false;
    iVar13 = 0;
    i = 0;
    bVar4 = false;
    uVar19 = 0;
    goto LAB_0011b9b7;
  }
  if ((byte)(bVar18 - 0x31) < 9) {
    uVar19 = bVar18 - 0x30;
    bVar18 = pbVar9[1];
    pbVar9 = pbVar9 + 1;
    dVar3 = 0.0;
    if (bVar1 == 0x2d) {
      if ((byte)(bVar18 - 0x30) < 10) {
        iVar13 = 0;
LAB_0011b912:
        if (uVar19 < 0xccccccc) {
LAB_0011b92a:
          uVar19 = ((uint)bVar18 + uVar19 * 10) - 0x30;
          iVar13 = iVar13 + 1;
          bVar18 = pbVar9[1];
          pbVar9 = pbVar9 + 1;
          if (9 < (byte)(bVar18 - 0x30)) goto LAB_0011b9b2;
          goto LAB_0011b912;
        }
        if (uVar19 != 0xccccccc) goto LAB_0011bdb9;
        if (bVar18 < 0x39) goto LAB_0011b92a;
        uVar19 = 0xccccccc;
        bVar18 = 0x39;
LAB_0011bdb9:
        i = (ulong)uVar19;
        if (bVar1 == 0x2d) {
          do {
            if ((0xccccccccccccccb < i) && ((i != 0xccccccccccccccc || (0x38 < bVar18))))
            goto LAB_0011be64;
            i = (ulong)(bVar18 & 0xf) + i * 10;
            iVar13 = iVar13 + 1;
            bVar18 = pbVar9[1];
            pbVar9 = pbVar9 + 1;
          } while ((byte)(bVar18 - 0x30) < 10);
        }
        else {
          do {
            if ((0x1999999999999998 < i) && ((i != 0x1999999999999999 || (0x35 < bVar18))))
            goto LAB_0011be64;
            i = (ulong)(bVar18 & 0xf) + i * 10;
            iVar13 = iVar13 + 1;
            bVar18 = pbVar9[1];
            pbVar9 = pbVar9 + 1;
          } while ((byte)(bVar18 - 0x30) < 10);
        }
        bVar6 = false;
        dVar3 = 0.0;
        bVar4 = true;
        bVar5 = false;
        goto LAB_0011b9b7;
      }
LAB_0011b9ab:
      iVar13 = 0;
    }
    else {
      if (9 < (byte)(bVar18 - 0x30)) goto LAB_0011b9ab;
      iVar13 = 0;
      do {
        if (0x19999998 < uVar19) {
          if (uVar19 != 0x19999999) goto LAB_0011bdb9;
          if (0x35 < bVar18) {
            uVar19 = 0x19999999;
            goto LAB_0011bdb9;
          }
        }
        uVar19 = ((uint)bVar18 + uVar19 * 10) - 0x30;
        iVar13 = iVar13 + 1;
        bVar18 = pbVar9[1];
        pbVar9 = pbVar9 + 1;
      } while ((byte)(bVar18 - 0x30) < 10);
    }
LAB_0011b9b2:
    bVar5 = false;
    bVar6 = false;
    i = 0;
    bVar4 = false;
    goto LAB_0011b9b7;
  }
  if (*(int *)(this + 0x30) != 0) {
    __assert_fail("!HasParseError()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                  ,0x335,
                  "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                 );
  }
  lVar10 = (long)pbVar9 - (long)pCVar2;
  *(undefined4 *)(this + 0x30) = 3;
LAB_0011bd28:
  *(long *)(this + 0x38) = lVar10;
LAB_0011bd94:
  is->src_ = (Ch *)pbVar9;
  is->head_ = pCVar2;
  return;
LAB_0011be64:
  auVar23._8_4_ = (int)(i >> 0x20);
  auVar23._0_8_ = i;
  auVar23._12_4_ = 0x45300000;
  dVar3 = (auVar23._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)i) - 4503599627370496.0);
  lVar10 = (long)pbVar9 - (long)pCVar2;
  do {
    if (1.7976931348623158e+307 <= dVar3) {
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                      ,0x357,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      *(undefined4 *)(this + 0x30) = 0xd;
      *(long *)(this + 0x38) = lVar10;
      goto LAB_0011bd94;
    }
    dVar3 = dVar3 * 10.0 + (double)(int)(bVar18 - 0x30);
    bVar18 = pbVar9[1];
    pbVar9 = pbVar9 + 1;
    lVar10 = lVar10 + 1;
    bVar6 = true;
  } while ((byte)(bVar18 - 0x30) < 10);
  bVar5 = true;
  bVar4 = true;
LAB_0011b9b7:
  if (bVar18 != 0x2e) {
    iVar17 = 0;
LAB_0011ba4f:
    iVar13 = 0;
    if ((bVar18 | 0x20) == 0x65) {
      uVar15 = (ulong)uVar19;
      if (bVar4) {
        uVar15 = i;
      }
      if (!bVar5) {
        auVar21._8_4_ = (int)(uVar15 >> 0x20);
        auVar21._0_8_ = uVar15;
        auVar21._12_4_ = 0x45300000;
        dVar3 = (auVar21._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)uVar15) - 4503599627370496.0);
        bVar5 = true;
      }
      bVar18 = pbVar9[1];
      if (bVar18 == 0x2b) {
        bVar6 = false;
LAB_0011bad5:
        pbVar11 = pbVar9 + 2;
        if (9 < (byte)(*pbVar11 - 0x30)) {
          pbVar9 = pbVar9 + 2;
LAB_0011bbc0:
          if (*(int *)(this + 0x30) != 0) {
            __assert_fail("!HasParseError()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                          ,0x3b3,
                          "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                         );
          }
          lVar10 = (long)pbVar9 - (long)pCVar2;
          *(undefined4 *)(this + 0x30) = 0xf;
          goto LAB_0011bd28;
        }
        pbVar9 = pbVar9 + 3;
        iVar14 = *pbVar11 - 0x30;
        if (bVar6) {
          bVar18 = *pbVar9;
          if ((byte)(bVar18 - 0x30) < 10) {
            do {
              iVar14 = (uint)bVar18 + iVar14 * 10 + -0x30;
              if (0xccccccb < iVar14) goto LAB_0011bb2f;
              pbVar9 = pbVar9 + 1;
              bVar18 = *pbVar9;
            } while ((byte)(bVar18 - 0x30) < 10);
          }
          else {
            bVar6 = true;
          }
          goto LAB_0011bc54;
        }
      }
      else {
        if (bVar18 == 0x2d) {
          bVar6 = true;
          goto LAB_0011bad5;
        }
        if (9 < (byte)(bVar18 - 0x30)) {
          pbVar9 = pbVar9 + 1;
          goto LAB_0011bbc0;
        }
        pbVar9 = pbVar9 + 2;
        iVar14 = bVar18 - 0x30;
      }
      lVar10 = (long)pbVar9 - (long)pCVar2;
      do {
        bVar18 = *pbVar9;
        if (9 < (byte)(bVar18 - 0x30)) {
          bVar6 = false;
          goto LAB_0011bc54;
        }
        pbVar9 = pbVar9 + 1;
        iVar14 = (bVar18 - 0x30) + iVar14 * 10;
        lVar10 = lVar10 + 1;
      } while (iVar14 <= 0x134 - iVar17);
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                      ,0x3ae,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      *(undefined4 *)(this + 0x30) = 0xd;
      *(long *)(this + 0x38) = lVar10;
      goto LAB_0011bd94;
    }
    goto LAB_0011bc61;
  }
  bVar18 = pbVar9[1];
  pbVar9 = pbVar9 + 1;
  if (9 < (byte)(bVar18 - 0x30)) {
    if (*(int *)(this + 0x30) != 0) {
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                    ,0x364,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    lVar10 = (long)pbVar9 - (long)pCVar2;
    *(undefined4 *)(this + 0x30) = 0xe;
    goto LAB_0011bd28;
  }
  iVar17 = 0;
  pbVar11 = pbVar9;
  if (bVar6) {
LAB_0011bc0e:
    do {
      pbVar9 = pbVar11;
      if (0x39 < bVar18) goto LAB_0011ba4f;
      if (iVar13 < 0x11) {
        dVar3 = dVar3 * 10.0 + (double)(int)(bVar18 - 0x30);
        iVar17 = iVar17 + -1;
        if (0.0 < dVar3) {
          iVar13 = iVar13 + 1;
        }
      }
      bVar18 = pbVar11[1];
      pbVar9 = pbVar11 + 1;
      pbVar11 = pbVar9;
    } while ('/' < (char)bVar18);
    iVar13 = 0;
    goto LAB_0011bc61;
  }
  if (!bVar4) {
    i = (ulong)uVar19;
  }
  iVar17 = 0;
  do {
    if ((0x39 < bVar18) || (i >> 0x35 != 0)) {
      auVar22._8_4_ = (int)(i >> 0x20);
      auVar22._0_8_ = i;
      auVar22._12_4_ = 0x45300000;
      dVar3 = (auVar22._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)i) - 4503599627370496.0);
      bVar5 = true;
      goto LAB_0011bc0e;
    }
    pbVar9 = pbVar11 + 1;
    iVar17 = iVar17 + -1;
    i = (ulong)(bVar18 - 0x30) + i * 10;
    iVar13 = iVar13 + (uint)(i != 0);
    bVar18 = pbVar11[1];
    pbVar11 = pbVar9;
  } while ('/' < (char)bVar18);
  dVar3 = (double)(long)i;
  iVar13 = 0;
LAB_0011bc66:
  uVar19 = iVar13 + iVar17;
  if ((int)uVar19 < -0x134) {
    dVar20 = 0.0;
    if (0xfffffd97 < uVar19) {
      dVar20 = (dVar3 / 1e+308) /
               *(double *)(internal::Pow10(int)::e + (ulong)(-uVar19 - 0x134) * 8);
    }
  }
  else if ((int)uVar19 < 0) {
    dVar20 = dVar3 / *(double *)(internal::Pow10(int)::e + (ulong)-uVar19 * 8);
  }
  else {
    if (0x134 < uVar19) {
      __assert_fail("n >= 0 && n <= 308",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/internal/pow10.h"
                    ,0x30,"double rapidjson::internal::Pow10(int)");
    }
    dVar20 = dVar3 * *(double *)(internal::Pow10(int)::e + (ulong)uVar19 * 8);
  }
  if (bVar1 == 0x2d) {
    dVar20 = -dVar20;
  }
  pdVar12 = (double *)(handler->stack_).stackTop_;
  if ((handler->stack_).stackEnd_ <= pdVar12 + 3) {
    internal::Stack<rapidjson::CrtAllocator>::
    Expand<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
              (&handler->stack_,1);
    pdVar12 = (double *)(handler->stack_).stackTop_;
  }
  (handler->stack_).stackTop_ = (char *)(pdVar12 + 3);
  pdVar12[1] = 0.0;
  *(undefined4 *)(pdVar12 + 2) = 0x4206;
  *pdVar12 = dVar20;
  goto LAB_0011bd94;
LAB_0011bb2f:
  do {
    pbVar11 = pbVar9 + 1;
    pbVar9 = pbVar9 + 1;
  } while ((byte)(*pbVar11 - 0x30) < 10);
LAB_0011bc54:
  iVar13 = -iVar14;
  if (!bVar6) {
    iVar13 = iVar14;
  }
LAB_0011bc61:
  if (bVar5) goto LAB_0011bc66;
  if (bVar4) {
    if (bVar1 == 0x2d) {
      bVar6 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
              ::Int64(handler,-i);
    }
    else {
      bVar6 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
              ::Uint64(handler,i);
    }
  }
  else if (bVar1 == 0x2d) {
    bVar6 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
            ::Int(handler,-uVar19);
  }
  else {
    bVar6 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
            ::Uint(handler,uVar19);
  }
  if (bVar6 != false) goto LAB_0011bd94;
  if (*(int *)(this + 0x30) != 0) {
    __assert_fail("!HasParseError()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                  ,0x3d6,
                  "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                 );
  }
  lVar10 = (long)pbVar9 - (long)pCVar2;
  *(undefined4 *)(this + 0x30) = 0x10;
  goto LAB_0011bd28;
}

Assistant:

Ch Peek() const { return *src_; }